

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O0

void absl::SetProgramUsageMessage(string_view new_usage_message)

{
  string *this;
  allocator<char> local_31;
  int local_30 [2];
  char *local_28;
  char *absl_raw_log_internal_filename;
  MutexLock l;
  string_view new_usage_message_local;
  
  l.mu_ = (Mutex *)new_usage_message._M_len;
  MutexLock::MutexLock
            ((MutexLock *)&absl_raw_log_internal_filename,
             (Mutex *)&flags_internal::(anonymous_namespace)::usage_message_guard);
  if (flags_internal::(anonymous_namespace)::program_usage_message_abi_cxx11_ != (string *)0x0) {
    local_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/flags/usage.cc"
    ;
    local_30[1] = 3;
    local_30[0] = 0x2e;
    base_internal::
    AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::operator()
              ((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)> *
               )raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_30 + 1),
               &local_28,local_30,(char (*) [39])"SetProgramUsageMessage() called twice.");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/flags/usage.cc"
                  ,0x2e,"void absl::SetProgramUsageMessage(absl::string_view)");
  }
  this = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this,(basic_string_view<char,_std::char_traits<char>_> *)&l,&local_31);
  flags_internal::(anonymous_namespace)::program_usage_message_abi_cxx11_ = this;
  std::allocator<char>::~allocator(&local_31);
  MutexLock::~MutexLock((MutexLock *)&absl_raw_log_internal_filename);
  return;
}

Assistant:

void SetProgramUsageMessage(absl::string_view new_usage_message) {
  absl::MutexLock l(&flags_internal::usage_message_guard);

  if (flags_internal::program_usage_message != nullptr) {
    ABSL_INTERNAL_LOG(FATAL, "SetProgramUsageMessage() called twice.");
    std::exit(1);
  }

  flags_internal::program_usage_message = new std::string(new_usage_message);
}